

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_source_interpolation.cc
# Opt level: O0

void __thiscall
sptk::InputSourceInterpolation::InputSourceInterpolation
          (InputSourceInterpolation *this,int frame_period,int interpolation_period,
          bool use_final_frame_for_exceeded_frame,InputSourceInterface *source)

{
  byte bVar1;
  size_type sVar2;
  byte in_CL;
  undefined4 in_EDX;
  undefined4 in_ESI;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> in_RDI;
  _func_int **in_R8;
  vector<double,_std::allocator<double>_> *this_00;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __result;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __last;
  
  InputSourceInterface::InputSourceInterface((InputSourceInterface *)in_RDI._M_current);
  ((InputSourceInterface *)in_RDI._M_current)->_vptr_InputSourceInterface =
       (_func_int **)&PTR__InputSourceInterpolation_00128c58;
  *(undefined4 *)&((InputSourceInterface *)in_RDI._M_current)[1]._vptr_InputSourceInterface = in_ESI
  ;
  *(undefined4 *)
   ((long)&((InputSourceInterface *)in_RDI._M_current)[1]._vptr_InputSourceInterface + 4) = in_EDX;
  *(int *)&((InputSourceInterface *)in_RDI._M_current)[2]._vptr_InputSourceInterface =
       *(int *)((long)&((InputSourceInterface *)in_RDI._M_current)[1]._vptr_InputSourceInterface + 4
               ) / 2;
  *(byte *)((long)&((InputSourceInterface *)in_RDI._M_current)[2]._vptr_InputSourceInterface + 4) =
       in_CL & 1;
  *(undefined4 *)&((InputSourceInterface *)in_RDI._M_current)[3]._vptr_InputSourceInterface = 0;
  *(undefined4 *)
   ((long)&((InputSourceInterface *)in_RDI._M_current)[3]._vptr_InputSourceInterface + 4) = 0;
  *(undefined4 *)&((InputSourceInterface *)in_RDI._M_current)[4]._vptr_InputSourceInterface = 0;
  ((InputSourceInterface *)in_RDI._M_current)[5]._vptr_InputSourceInterface = in_R8;
  *(undefined1 *)&((InputSourceInterface *)in_RDI._M_current)[6]._vptr_InputSourceInterface = 1;
  ::std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x1079ee);
  __result._M_current = in_RDI._M_current + 10;
  ::std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x107a01);
  __last._M_current = in_RDI._M_current + 0xd;
  ::std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x107a14);
  if ((((*(int *)&((InputSourceInterface *)in_RDI._M_current)[1]._vptr_InputSourceInterface < 1) ||
       (*(int *)((long)&((InputSourceInterface *)in_RDI._M_current)[1]._vptr_InputSourceInterface +
                4) < 0)) ||
      (*(int *)&((InputSourceInterface *)in_RDI._M_current)[1]._vptr_InputSourceInterface / 2 <
       *(int *)((long)&((InputSourceInterface *)in_RDI._M_current)[1]._vptr_InputSourceInterface + 4
               ))) ||
     ((((InputSourceInterface *)in_RDI._M_current)[5]._vptr_InputSourceInterface ==
       (_func_int **)0x0 ||
      (bVar1 = (**(code **)(*((InputSourceInterface *)in_RDI._M_current)[5].
                             _vptr_InputSourceInterface + 0x18))
                         (((InputSourceInterface *)in_RDI._M_current)[5]._vptr_InputSourceInterface,
                          2,(long)*(int *)&((InputSourceInterface *)in_RDI._M_current)[1].
                                           _vptr_InputSourceInterface % 2 & 0xffffffff),
      (bVar1 & 1) == 0)))) {
    *(undefined1 *)&((InputSourceInterface *)in_RDI._M_current)[6]._vptr_InputSourceInterface = 0;
  }
  else {
    bVar1 = (**(code **)(*((InputSourceInterface *)in_RDI._M_current)[5]._vptr_InputSourceInterface
                        + 0x20))
                      (((InputSourceInterface *)in_RDI._M_current)[5]._vptr_InputSourceInterface,
                       (InputSourceInterface *)in_RDI._M_current + 7);
    if ((bVar1 & 1) == 0) {
      *(undefined4 *)&((InputSourceInterface *)in_RDI._M_current)[3]._vptr_InputSourceInterface = 0;
    }
    else {
      *(int *)&((InputSourceInterface *)in_RDI._M_current)[3]._vptr_InputSourceInterface =
           *(int *)&((InputSourceInterface *)in_RDI._M_current)[1]._vptr_InputSourceInterface + 1;
      sVar2 = ::std::vector<double,_std::allocator<double>_>::size
                        ((vector<double,_std::allocator<double>_> *)
                         ((InputSourceInterface *)in_RDI._M_current + 7));
      *(int *)((long)&((InputSourceInterface *)in_RDI._M_current)[3]._vptr_InputSourceInterface + 4)
           = (int)sVar2;
      bVar1 = (**(code **)(*((InputSourceInterface *)in_RDI._M_current)[5].
                            _vptr_InputSourceInterface + 0x20))
                        (((InputSourceInterface *)in_RDI._M_current)[5]._vptr_InputSourceInterface,
                         (InputSourceInterface *)in_RDI._M_current + 10);
      if ((bVar1 & 1) == 0) {
        ::std::vector<double,_std::allocator<double>_>::resize
                  ((vector<double,_std::allocator<double>_> *)__last._M_current,
                   (size_type)__result._M_current);
        this_00 = (vector<double,_std::allocator<double>_> *)
                  ((InputSourceInterface *)in_RDI._M_current + 7);
        ::std::vector<double,_std::allocator<double>_>::begin(this_00);
        ::std::vector<double,_std::allocator<double>_>::end(this_00);
        ::std::vector<double,_std::allocator<double>_>::begin(this_00);
        ::std::
        copy<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                  (in_RDI,__last,__result);
        *(undefined4 *)&((InputSourceInterface *)in_RDI._M_current)[3]._vptr_InputSourceInterface =
             1;
      }
      if (0 < *(int *)((long)&((InputSourceInterface *)in_RDI._M_current)[1].
                              _vptr_InputSourceInterface + 4)) {
        ::std::vector<double,_std::allocator<double>_>::resize
                  ((vector<double,_std::allocator<double>_> *)__last._M_current,
                   (size_type)__result._M_current);
        CalculateIncrement((InputSourceInterpolation *)__last._M_current);
      }
    }
  }
  return;
}

Assistant:

InputSourceInterpolation::InputSourceInterpolation(
    int frame_period, int interpolation_period,
    bool use_final_frame_for_exceeded_frame, InputSourceInterface* source)
    : frame_period_(frame_period),
      interpolation_period_(interpolation_period),
      first_interpolation_period_(interpolation_period_ / 2),
      use_final_frame_for_exceeded_frame_(use_final_frame_for_exceeded_frame),
      remained_num_samples_(0),
      data_length_(0),
      point_index_in_frame_(0),
      source_(source),
      is_valid_(true) {
  if (frame_period_ <= 0 || interpolation_period_ < 0 ||
      frame_period_ / 2 < interpolation_period_ || NULL == source_ ||
      !source_->IsValid()) {
    is_valid_ = false;
    return;
  }

  if (!source_->Get(&curr_data_)) {
    remained_num_samples_ = 0;
    return;
  }

  remained_num_samples_ = frame_period_ + 1;
  data_length_ = static_cast<int>(curr_data_.size());

  if (!source_->Get(&next_data_)) {
    next_data_.resize(data_length_);
    std::copy(curr_data_.begin(), curr_data_.end(), next_data_.begin());
    remained_num_samples_ = 1;
  }

  if (0 < interpolation_period_) {
    increment_.resize(data_length_);
    CalculateIncrement();
  }
}